

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::EnumSchema::Enumerant> * __thiscall
capnp::EnumSchema::findEnumerantByName
          (Maybe<capnp::EnumSchema::Enumerant> *__return_storage_ptr__,EnumSchema *this,
          StringPtr name)

{
  RawSchema *this_00;
  EnumerantList *in_R9;
  StringPtr name_00;
  EnumerantList local_70;
  RawSchema *local_38;
  char *local_30;
  EnumSchema *local_28;
  EnumSchema *this_local;
  StringPtr name_local;
  
  local_30 = (char *)name.content.size_;
  local_38 = (RawSchema *)name.content.ptr;
  this_00 = ((this->super_Schema).raw)->generic;
  local_28 = this;
  this_local = (EnumSchema *)local_38;
  name_local.content.ptr = local_30;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  getEnumerants(&local_70,this);
  name_00.content.size_ = (size_t)&local_70;
  name_00.content.ptr = local_30;
  anon_unknown_34::findSchemaMemberByName<capnp::EnumSchema::EnumerantList>
            (__return_storage_ptr__,(anon_unknown_34 *)this_00,local_38,name_00,in_R9);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<EnumSchema::Enumerant> EnumSchema::findEnumerantByName(kj::StringPtr name) const {
  return findSchemaMemberByName(raw->generic, name, getEnumerants());
}